

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

void __thiscall
PhyloTree::setEdges(PhyloTree *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges)

{
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_move_assign(&this->edges);
  return;
}

Assistant:

void PhyloTree::setEdges(vector<PhyloTreeEdge> edges) {
    this->edges = std::move(edges);
}